

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool ConnectionExists(Curl_easy *data,connectdata *needle,connectdata **usethis,_Bool *force_reuse,
                      _Bool *waitpipe)

{
  connectdata *conn;
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  curl_prot_t cVar5;
  curlntlm cVar6;
  uint uVar7;
  connectbundle *pcVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  http_conn *httpc;
  Curl_easy *entry;
  Curl_llist_element *e;
  size_t multiplexed;
  Curl_llist_element *pCStack_68;
  _Bool match;
  Curl_llist_element *curr;
  _Bool wantProxyNTLMhttp;
  _Bool wantNTLMhttp;
  connectbundle *bundle;
  _Bool canmultiplex;
  connectdata *pcStack_48;
  _Bool foundPendingCandidate;
  connectdata *chosen;
  connectdata *check;
  _Bool *waitpipe_local;
  _Bool *force_reuse_local;
  connectdata **usethis_local;
  connectdata *needle_local;
  Curl_easy *data_local;
  
  pcStack_48 = (connectdata *)0x0;
  bVar2 = false;
  iVar4 = IsMultiplexingPossible(data,needle);
  bVar10 = iVar4 != 0;
  bVar11 = false;
  if (((data->state).authhost.want & 0x28) != 0) {
    bVar11 = (needle->handler->protocol & 3) != 0;
  }
  bVar12 = false;
  if (((*(uint *)&(needle->bits).field_0x4 >> 2 & 1) != 0) &&
     (bVar12 = false, ((data->state).authproxy.want & 0x28) != 0)) {
    bVar12 = (needle->handler->protocol & 3) != 0;
  }
  *force_reuse = false;
  *waitpipe = false;
  pcVar8 = Curl_conncache_find_bundle(data,needle,(data->state).conn_cache);
  conn = pcStack_48;
  if (pcVar8 != (connectbundle *)0x0) {
    pcVar9 = "serially";
    if (pcVar8->multiuse == 2) {
      pcVar9 = "can multiplex";
    }
    Curl_infof(data,"Found bundle for host: %p [%s]",pcVar8,pcVar9);
    if (bVar10) {
      if (pcVar8->multiuse == 0) {
        if ((*(ulong *)&(data->set).field_0x8e2 >> 0x2a & 1) != 0) {
          Curl_infof(data,"Server doesn\'t support multiplex yet, wait");
          *waitpipe = true;
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
          }
          return false;
        }
        Curl_infof(data,"Server doesn\'t support multiplex (yet)");
        bVar10 = false;
      }
      if ((pcVar8->multiuse == 2) && (_Var3 = Curl_multiplex_wanted(data->multi), !_Var3)) {
        Curl_infof(data,"Could multiplex, but not asked to");
        bVar10 = false;
      }
      if (pcVar8->multiuse == -1) {
        Curl_infof(data,"Can not multiplex, even if we wanted to");
        bVar10 = false;
      }
    }
    pCStack_68 = (pcVar8->conn_list).head;
LAB_00a0b021:
    do {
      while( true ) {
        do {
          conn = pcStack_48;
          if (pCStack_68 == (Curl_llist_element *)0x0) goto LAB_00a0b93d;
          bVar1 = false;
          e = (Curl_llist_element *)0x0;
          conn = (connectdata *)pCStack_68->ptr;
          pCStack_68 = pCStack_68->next;
        } while ((conn->connect_only != '\0') || ((*(uint *)&(conn->bits).field_0x4 >> 6 & 1) != 0))
        ;
        _Var3 = extract_if_dead(conn,data);
        if (!_Var3) break;
        Curl_disconnect(data,conn,true);
      }
    } while (((data->set).ipver != '\0') && ((data->set).ipver != conn->ip_version));
    if (pcVar8->multiuse == 2) {
      e = (Curl_llist_element *)(conn->easyq).size;
    }
    if (!bVar10) {
      if (e != (Curl_llist_element *)0x0) goto LAB_00a0b021;
      if (conn->sock[0] == -1) {
        bVar2 = true;
        Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse",conn->connection_id);
        goto LAB_00a0b021;
      }
    }
    if ((((((needle->handler->flags & 1) == (conn->handler->flags & 1)) ||
          ((cVar5 = get_protocol_family(conn->handler), cVar5 == needle->handler->protocol &&
           ((*(uint *)&(conn->bits).field_0x4 >> 0x1c & 1) != 0)))) &&
         (((*(uint *)&(needle->bits).field_0x4 & 1) == (*(uint *)&(conn->bits).field_0x4 & 1) &&
          (((*(uint *)&(needle->bits).field_0x4 >> 1 & 1) ==
            (*(uint *)&(conn->bits).field_0x4 >> 1 & 1) &&
           (((((*(uint *)&(needle->bits).field_0x4 >> 1 & 1) == 0 ||
              (_Var3 = socks_proxy_info_matches(&needle->socks_proxy,&conn->socks_proxy), _Var3)) &&
             ((*(uint *)&(needle->bits).field_0x4 >> 9 & 1) ==
              (*(uint *)&(conn->bits).field_0x4 >> 9 & 1))) &&
            ((*(uint *)&(needle->bits).field_0x4 >> 10 & 1) ==
             (*(uint *)&(conn->bits).field_0x4 >> 10 & 1))))))))) &&
        ((((*(uint *)&(needle->bits).field_0x4 & 1) == 0 ||
          (((_Var3 = proxy_info_matches(&needle->http_proxy,&conn->http_proxy), _Var3 &&
            ((*(uint *)&(needle->bits).field_0x4 >> 3 & 1) ==
             (*(uint *)&(conn->bits).field_0x4 >> 3 & 1))) &&
           (((needle->http_proxy).proxytype != '\x02' ||
            (((((needle->handler->flags & 1) == 0 ||
               ((_Var3 = Curl_ssl_config_matches(&needle->proxy_ssl_config,&conn->proxy_ssl_config),
                _Var3 && (conn->proxy_ssl[0].state == ssl_connection_complete)))) &&
              (_Var3 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config), _Var3)) &&
             (conn->ssl[0].state == ssl_connection_complete)))))))) &&
         (((bVar10 || ((conn->easyq).size == 0)) &&
          (((conn->easyq).size == 0 ||
           (*(Curl_multi **)((long)((conn->easyq).head)->ptr + 0xb8) == data->multi)))))))) &&
       ((((needle->localdev == (char *)0x0 && (needle->localport == 0)) ||
         ((conn->localport == needle->localport &&
          ((conn->localportrange == needle->localportrange &&
           ((needle->localdev == (char *)0x0 ||
            ((conn->localdev != (char *)0x0 &&
             (iVar4 = strcmp(conn->localdev,needle->localdev), iVar4 == 0)))))))))) &&
        ((((needle->handler->flags & 0x80) != 0 ||
          ((((iVar4 = Curl_timestrcmp(needle->user,conn->user), iVar4 == 0 &&
             (iVar4 = Curl_timestrcmp(needle->passwd,conn->passwd), iVar4 == 0)) &&
            (iVar4 = Curl_timestrcmp(needle->sasl_authzid,conn->sasl_authzid), iVar4 == 0)) &&
           (iVar4 = Curl_timestrcmp(needle->oauth_bearer,conn->oauth_bearer), iVar4 == 0)))) &&
         (((((needle->handler->protocol & 3) == 0 || (conn->httpversion < 0x14)) ||
           (2 < (data->state).httpwant)) &&
          (cVar5 = get_protocol_family(needle->handler), cVar5 != 0x30)))))))) {
      if ((((needle->handler->flags & 1) == 0) && ((*(uint *)&(needle->bits).field_0x4 & 1) != 0))
         && ((*(uint *)&(needle->bits).field_0x4 >> 3 & 1) == 0)) {
        bVar1 = true;
      }
      else {
        iVar4 = Curl_strcasecompare(needle->handler->scheme,conn->handler->scheme);
        if (((iVar4 != 0) ||
            ((cVar5 = get_protocol_family(conn->handler), cVar5 == needle->handler->protocol &&
             ((*(uint *)&(conn->bits).field_0x4 >> 0x1c & 1) != 0)))) &&
           ((((*(uint *)&(needle->bits).field_0x4 >> 9 & 1) == 0 ||
             (iVar4 = Curl_strcasecompare((needle->conn_to_host).name,(conn->conn_to_host).name),
             iVar4 != 0)) &&
            (((((*(uint *)&(needle->bits).field_0x4 >> 10 & 1) == 0 ||
               (needle->conn_to_port == conn->conn_to_port)) &&
              (iVar4 = Curl_strcasecompare((needle->host).name,(conn->host).name), iVar4 != 0)) &&
             (needle->remote_port == conn->remote_port)))))) {
          if ((needle->handler->flags & 1) != 0) {
            _Var3 = Curl_ssl_config_matches(&needle->ssl_config,&conn->ssl_config);
            if (!_Var3) goto LAB_00a0b021;
            if (conn->ssl[0].state != ssl_connection_complete) {
              bVar2 = true;
              goto LAB_00a0b021;
            }
          }
          bVar1 = true;
        }
      }
      if (bVar1) {
        if (bVar11) {
          iVar4 = Curl_timestrcmp(needle->user,conn->user);
          if ((iVar4 != 0) || (iVar4 = Curl_timestrcmp(needle->passwd,conn->passwd), iVar4 != 0)) {
            if (conn->http_ntlm_state == NTLMSTATE_NONE) {
              pcStack_48 = conn;
            }
            goto LAB_00a0b021;
          }
        }
        else if (conn->http_ntlm_state != NTLMSTATE_NONE) goto LAB_00a0b021;
        if (bVar12) {
          if ((((conn->http_proxy).user == (char *)0x0) ||
              ((conn->http_proxy).passwd == (char *)0x0)) ||
             (iVar4 = Curl_timestrcmp((needle->http_proxy).user,(conn->http_proxy).user), iVar4 != 0
             )) goto LAB_00a0b021;
          cVar6 = Curl_timestrcmp((needle->http_proxy).passwd,(conn->http_proxy).passwd);
        }
        else {
          cVar6 = conn->proxy_ntlm_state;
        }
        if (cVar6 == NTLMSTATE_NONE) {
          if ((!bVar11) && (!bVar12)) {
            if ((!bVar10) || (e == (Curl_llist_element *)0x0)) goto LAB_00a0b93d;
            if ((*(uint *)&(conn->bits).field_0x4 >> 0x18 & 1) != 0) {
              if ((Curl_llist_element *)(ulong)(conn->proto).httpc.settings.max_concurrent_streams
                  <= e) {
                Curl_infof(data,"MAX_CONCURRENT_STREAMS reached, skip (%zu)",e);
                goto LAB_00a0b021;
              }
              uVar7 = Curl_multi_max_concurrent_streams(data->multi);
              if ((Curl_llist_element *)(ulong)uVar7 <= e) {
                Curl_infof(data,"client side MAX_CONCURRENT_STREAMS reached, skip (%zu)",e);
                goto LAB_00a0b021;
              }
            }
            Curl_infof(data,"Multiplexed connection found");
            goto LAB_00a0b93d;
          }
          if (((bVar11) && (conn->http_ntlm_state != NTLMSTATE_NONE)) ||
             ((pcStack_48 = conn, bVar12 && (conn->proxy_ntlm_state != NTLMSTATE_NONE))))
          goto LAB_00a0b83c;
        }
      }
    }
    goto LAB_00a0b021;
  }
LAB_00a0b93d:
  pcStack_48 = conn;
  if (pcStack_48 == (connectdata *)0x0) {
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
    if ((bVar2) && ((*(ulong *)&(data->set).field_0x8e2 >> 0x2a & 1) != 0)) {
      Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set");
      *waitpipe = true;
    }
    data_local._7_1_ = false;
  }
  else {
    Curl_attach_connection(data,pcStack_48);
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
    *usethis = pcStack_48;
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
LAB_00a0b83c:
  *force_reuse = true;
  goto LAB_00a0b93d;
}

Assistant:

static bool
ConnectionExists(struct Curl_easy *data,
                 struct connectdata *needle,
                 struct connectdata **usethis,
                 bool *force_reuse,
                 bool *waitpipe)
{
  struct connectdata *check;
  struct connectdata *chosen = 0;
  bool foundPendingCandidate = FALSE;
  bool canmultiplex = IsMultiplexingPossible(data, needle);
  struct connectbundle *bundle;

#ifdef USE_NTLM
  bool wantNTLMhttp = ((data->state.authhost.want &
                        (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                       (needle->handler->protocol & PROTO_FAMILY_HTTP));
#ifndef CURL_DISABLE_PROXY
  bool wantProxyNTLMhttp = (needle->bits.proxy_user_passwd &&
                            ((data->state.authproxy.want &
                              (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
                             (needle->handler->protocol & PROTO_FAMILY_HTTP)));
#else
  bool wantProxyNTLMhttp = FALSE;
#endif
#endif

  *force_reuse = FALSE;
  *waitpipe = FALSE;

  /* Look up the bundle with all the connections to this particular host.
     Locks the connection cache, beware of early returns! */
  bundle = Curl_conncache_find_bundle(data, needle, data->state.conn_cache);
  if(bundle) {
    /* Max pipe length is zero (unlimited) for multiplexed connections */
    struct Curl_llist_element *curr;

    infof(data, "Found bundle for host: %p [%s]",
          (void *)bundle, (bundle->multiuse == BUNDLE_MULTIPLEX ?
                           "can multiplex" : "serially"));

    /* We can't multiplex if we don't know anything about the server */
    if(canmultiplex) {
      if(bundle->multiuse == BUNDLE_UNKNOWN) {
        if(data->set.pipewait) {
          infof(data, "Server doesn't support multiplex yet, wait");
          *waitpipe = TRUE;
          CONNCACHE_UNLOCK(data);
          return FALSE; /* no re-use */
        }

        infof(data, "Server doesn't support multiplex (yet)");
        canmultiplex = FALSE;
      }
      if((bundle->multiuse == BUNDLE_MULTIPLEX) &&
         !Curl_multiplex_wanted(data->multi)) {
        infof(data, "Could multiplex, but not asked to");
        canmultiplex = FALSE;
      }
      if(bundle->multiuse == BUNDLE_NO_MULTIUSE) {
        infof(data, "Can not multiplex, even if we wanted to");
        canmultiplex = FALSE;
      }
    }

    curr = bundle->conn_list.head;
    while(curr) {
      bool match = FALSE;
      size_t multiplexed = 0;

      /*
       * Note that if we use a HTTP proxy in normal mode (no tunneling), we
       * check connections to that proxy and not to the actual remote server.
       */
      check = curr->ptr;
      curr = curr->next;

      if(check->connect_only || check->bits.close)
        /* connect-only or to-be-closed connections will not be reused */
        continue;

      if(extract_if_dead(check, data)) {
        /* disconnect it */
        Curl_disconnect(data, check, TRUE);
        continue;
      }

      if(data->set.ipver != CURL_IPRESOLVE_WHATEVER
          && data->set.ipver != check->ip_version) {
        /* skip because the connection is not via the requested IP version */
        continue;
      }

      if(bundle->multiuse == BUNDLE_MULTIPLEX)
        multiplexed = CONN_INUSE(check);

      if(!canmultiplex) {
        if(multiplexed) {
          /* can only happen within multi handles, and means that another easy
             handle is using this connection */
          continue;
        }

        if(Curl_resolver_asynch()) {
          /* primary_ip[0] is NUL only if the resolving of the name hasn't
             completed yet and until then we don't re-use this connection */
          if(!check->primary_ip[0]) {
            infof(data,
                  "Connection #%ld is still name resolving, can't reuse",
                  check->connection_id);
            continue;
          }
        }

        if(check->sock[FIRSTSOCKET] == CURL_SOCKET_BAD) {
          foundPendingCandidate = TRUE;
          /* Don't pick a connection that hasn't connected yet */
          infof(data, "Connection #%ld isn't open enough, can't reuse",
                check->connection_id);
          continue;
        }
      }

#ifdef USE_UNIX_SOCKETS
      if(needle->unix_domain_socket) {
        if(!check->unix_domain_socket)
          continue;
        if(strcmp(needle->unix_domain_socket, check->unix_domain_socket))
          continue;
        if(needle->bits.abstract_unix_socket !=
           check->bits.abstract_unix_socket)
          continue;
      }
      else if(check->unix_domain_socket)
        continue;
#endif

      if((needle->handler->flags&PROTOPT_SSL) !=
         (check->handler->flags&PROTOPT_SSL))
        /* don't do mixed SSL and non-SSL connections */
        if(get_protocol_family(check->handler) !=
           needle->handler->protocol || !check->bits.tls_upgraded)
          /* except protocols that have been upgraded via TLS */
          continue;

#ifndef CURL_DISABLE_PROXY
      if(needle->bits.httpproxy != check->bits.httpproxy ||
         needle->bits.socksproxy != check->bits.socksproxy)
        continue;

      if(needle->bits.socksproxy &&
        !socks_proxy_info_matches(&needle->socks_proxy,
                                  &check->socks_proxy))
        continue;
#endif
      if(needle->bits.conn_to_host != check->bits.conn_to_host)
        /* don't mix connections that use the "connect to host" feature and
         * connections that don't use this feature */
        continue;

      if(needle->bits.conn_to_port != check->bits.conn_to_port)
        /* don't mix connections that use the "connect to port" feature and
         * connections that don't use this feature */
        continue;

#ifndef CURL_DISABLE_PROXY
      if(needle->bits.httpproxy) {
        if(!proxy_info_matches(&needle->http_proxy, &check->http_proxy))
          continue;

        if(needle->bits.tunnel_proxy != check->bits.tunnel_proxy)
          continue;

        if(needle->http_proxy.proxytype == CURLPROXY_HTTPS) {
          /* use https proxy */
          if(needle->handler->flags&PROTOPT_SSL) {
            /* use double layer ssl */
            if(!Curl_ssl_config_matches(&needle->proxy_ssl_config,
                                        &check->proxy_ssl_config))
              continue;
            if(check->proxy_ssl[FIRSTSOCKET].state != ssl_connection_complete)
              continue;
          }

          if(!Curl_ssl_config_matches(&needle->ssl_config,
                                      &check->ssl_config))
            continue;
          if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete)
            continue;
        }
      }
#endif

      if(!canmultiplex && CONN_INUSE(check))
        /* this request can't be multiplexed but the checked connection is
           already in use so we skip it */
        continue;

      if(CONN_INUSE(check)) {
        /* Subject for multiplex use if 'checks' belongs to the same multi
           handle as 'data' is. */
        struct Curl_llist_element *e = check->easyq.head;
        struct Curl_easy *entry = e->ptr;
        if(entry->multi != data->multi)
          continue;
      }

      if(needle->localdev || needle->localport) {
        /* If we are bound to a specific local end (IP+port), we must not
           re-use a random other one, although if we didn't ask for a
           particular one we can reuse one that was bound.

           This comparison is a bit rough and too strict. Since the input
           parameters can be specified in numerous ways and still end up the
           same it would take a lot of processing to make it really accurate.
           Instead, this matching will assume that re-uses of bound connections
           will most likely also re-use the exact same binding parameters and
           missing out a few edge cases shouldn't hurt anyone very much.
        */
        if((check->localport != needle->localport) ||
           (check->localportrange != needle->localportrange) ||
           (needle->localdev &&
            (!check->localdev || strcmp(check->localdev, needle->localdev))))
          continue;
      }

      if(!(needle->handler->flags & PROTOPT_CREDSPERREQUEST)) {
        /* This protocol requires credentials per connection,
           so verify that we're using the same name and password as well */
        if(Curl_timestrcmp(needle->user, check->user) ||
           Curl_timestrcmp(needle->passwd, check->passwd) ||
           Curl_timestrcmp(needle->sasl_authzid, check->sasl_authzid) ||
           Curl_timestrcmp(needle->oauth_bearer, check->oauth_bearer)) {
          /* one of them was different */
          continue;
        }
      }

      /* If multiplexing isn't enabled on the h2 connection and h1 is
         explicitly requested, handle it: */
      if((needle->handler->protocol & PROTO_FAMILY_HTTP) &&
         (check->httpversion >= 20) &&
         (data->state.httpwant < CURL_HTTP_VERSION_2_0))
        continue;

      if(get_protocol_family(needle->handler) == PROTO_FAMILY_SSH) {
        if(!ssh_config_matches(needle, check))
          continue;
      }

      if((needle->handler->flags&PROTOPT_SSL)
#ifndef CURL_DISABLE_PROXY
         || !needle->bits.httpproxy || needle->bits.tunnel_proxy
#endif
        ) {
        /* The requested connection does not use a HTTP proxy or it uses SSL or
           it is a non-SSL protocol tunneled or it is a non-SSL protocol which
           is allowed to be upgraded via TLS */

        if((strcasecompare(needle->handler->scheme, check->handler->scheme) ||
            (get_protocol_family(check->handler) ==
             needle->handler->protocol && check->bits.tls_upgraded)) &&
           (!needle->bits.conn_to_host || strcasecompare(
            needle->conn_to_host.name, check->conn_to_host.name)) &&
           (!needle->bits.conn_to_port ||
             needle->conn_to_port == check->conn_to_port) &&
           strcasecompare(needle->host.name, check->host.name) &&
           needle->remote_port == check->remote_port) {
          /* The schemes match or the protocol family is the same and the
             previous connection was TLS upgraded, and the hostname and host
             port match */
          if(needle->handler->flags & PROTOPT_SSL) {
            /* This is a SSL connection so verify that we're using the same
               SSL options as well */
            if(!Curl_ssl_config_matches(&needle->ssl_config,
                                        &check->ssl_config)) {
              DEBUGF(infof(data,
                           "Connection #%ld has different SSL parameters, "
                           "can't reuse",
                           check->connection_id));
              continue;
            }
            if(check->ssl[FIRSTSOCKET].state != ssl_connection_complete) {
              foundPendingCandidate = TRUE;
              DEBUGF(infof(data,
                           "Connection #%ld has not started SSL connect, "
                           "can't reuse",
                           check->connection_id));
              continue;
            }
          }
          match = TRUE;
        }
      }
      else {
        /* The requested connection is using the same HTTP proxy in normal
           mode (no tunneling) */
        match = TRUE;
      }

      if(match) {
#if defined(USE_NTLM)
        /* If we are looking for an HTTP+NTLM connection, check if this is
           already authenticating with the right credentials. If not, keep
           looking so that we can reuse NTLM connections if
           possible. (Especially we must not reuse the same connection if
           partway through a handshake!) */
        if(wantNTLMhttp) {
          if(Curl_timestrcmp(needle->user, check->user) ||
             Curl_timestrcmp(needle->passwd, check->passwd)) {

            /* we prefer a credential match, but this is at least a connection
               that can be reused and "upgraded" to NTLM */
            if(check->http_ntlm_state == NTLMSTATE_NONE)
              chosen = check;
            continue;
          }
        }
        else if(check->http_ntlm_state != NTLMSTATE_NONE) {
          /* Connection is using NTLM auth but we don't want NTLM */
          continue;
        }

#ifndef CURL_DISABLE_PROXY
        /* Same for Proxy NTLM authentication */
        if(wantProxyNTLMhttp) {
          /* Both check->http_proxy.user and check->http_proxy.passwd can be
           * NULL */
          if(!check->http_proxy.user || !check->http_proxy.passwd)
            continue;

          if(Curl_timestrcmp(needle->http_proxy.user,
                             check->http_proxy.user) ||
             Curl_timestrcmp(needle->http_proxy.passwd,
                             check->http_proxy.passwd))
            continue;
        }
        else if(check->proxy_ntlm_state != NTLMSTATE_NONE) {
          /* Proxy connection is using NTLM auth but we don't want NTLM */
          continue;
        }
#endif
        if(wantNTLMhttp || wantProxyNTLMhttp) {
          /* Credentials are already checked, we can use this connection */
          chosen = check;

          if((wantNTLMhttp &&
             (check->http_ntlm_state != NTLMSTATE_NONE)) ||
              (wantProxyNTLMhttp &&
               (check->proxy_ntlm_state != NTLMSTATE_NONE))) {
            /* We must use this connection, no other */
            *force_reuse = TRUE;
            break;
          }

          /* Continue look up for a better connection */
          continue;
        }
#endif
        if(canmultiplex) {
          /* We can multiplex if we want to. Let's continue looking for
             the optimal connection to use. */

          if(!multiplexed) {
            /* We have the optimal connection. Let's stop looking. */
            chosen = check;
            break;
          }

#ifdef USE_NGHTTP2
          /* If multiplexed, make sure we don't go over concurrency limit */
          if(check->bits.multiplex) {
            /* Multiplexed connections can only be HTTP/2 for now */
            struct http_conn *httpc = &check->proto.httpc;
            if(multiplexed >= httpc->settings.max_concurrent_streams) {
              infof(data, "MAX_CONCURRENT_STREAMS reached, skip (%zu)",
                    multiplexed);
              continue;
            }
            else if(multiplexed >=
                    Curl_multi_max_concurrent_streams(data->multi)) {
              infof(data, "client side MAX_CONCURRENT_STREAMS reached"
                    ", skip (%zu)",
                    multiplexed);
              continue;
            }
          }
#endif
          /* When not multiplexed, we have a match here! */
          chosen = check;
          infof(data, "Multiplexed connection found");
          break;
        }
        else {
          /* We have found a connection. Let's stop searching. */
          chosen = check;
          break;
        }
      }
    }
  }

  if(chosen) {
    /* mark it as used before releasing the lock */
    Curl_attach_connection(data, chosen);
    CONNCACHE_UNLOCK(data);
    *usethis = chosen;
    return TRUE; /* yes, we found one to use! */
  }
  CONNCACHE_UNLOCK(data);

  if(foundPendingCandidate && data->set.pipewait) {
    infof(data,
          "Found pending candidate for reuse and CURLOPT_PIPEWAIT is set");
    *waitpipe = TRUE;
  }

  return FALSE; /* no matching connecting exists */
}